

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QHstsPolicy>::emplace<QHstsPolicy>
          (QMovableArrayOps<QHstsPolicy> *this,qsizetype i,QHstsPolicy *args)

{
  QHstsPolicy **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter IStack_58;
  QHstsPolicy tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QHstsPolicy>).super_QArrayDataPointer<QHstsPolicy>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QHstsPolicy>).super_QArrayDataPointer<QHstsPolicy>.size == i)
    {
      qVar5 = QArrayDataPointer<QHstsPolicy>::freeSpaceAtEnd((QArrayDataPointer<QHstsPolicy> *)this)
      ;
      if (qVar5 == 0) goto LAB_001c978a;
      QHstsPolicy::QHstsPolicy
                ((this->super_QGenericArrayOps<QHstsPolicy>).super_QArrayDataPointer<QHstsPolicy>.
                 ptr + (this->super_QGenericArrayOps<QHstsPolicy>).
                       super_QArrayDataPointer<QHstsPolicy>.size,args);
LAB_001c986f:
      pqVar2 = &(this->super_QGenericArrayOps<QHstsPolicy>).super_QArrayDataPointer<QHstsPolicy>.
                size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_001c982e;
    }
LAB_001c978a:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QHstsPolicy>::freeSpaceAtBegin
                        ((QArrayDataPointer<QHstsPolicy> *)this);
      if (qVar5 != 0) {
        QHstsPolicy::QHstsPolicy
                  ((this->super_QGenericArrayOps<QHstsPolicy>).super_QArrayDataPointer<QHstsPolicy>.
                   ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QHstsPolicy>).super_QArrayDataPointer<QHstsPolicy>.
                   ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_001c986f;
      }
    }
  }
  tmp.d.d.ptr = (QSharedDataPointer<QHstsPolicyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHstsPolicy::QHstsPolicy(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QHstsPolicy>).super_QArrayDataPointer<QHstsPolicy>.size != 0
  ;
  QArrayDataPointer<QHstsPolicy>::detachAndGrow
            ((QArrayDataPointer<QHstsPolicy> *)this,(uint)(i == 0 && bVar6),1,(QHstsPolicy **)0x0,
             (QArrayDataPointer<QHstsPolicy> *)0x0);
  if (i == 0 && bVar6) {
    QHstsPolicy::QHstsPolicy
              ((this->super_QGenericArrayOps<QHstsPolicy>).super_QArrayDataPointer<QHstsPolicy>.ptr
               + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QHstsPolicy>).super_QArrayDataPointer<QHstsPolicy>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QHstsPolicy>).super_QArrayDataPointer<QHstsPolicy>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&IStack_58,(QArrayDataPointer<QHstsPolicy> *)this,i,1);
    QHstsPolicy::QHstsPolicy(IStack_58.displaceFrom,&tmp);
    IStack_58.displaceFrom = IStack_58.displaceFrom + 1;
    Inserter::~Inserter(&IStack_58);
  }
  QHstsPolicy::~QHstsPolicy(&tmp);
LAB_001c982e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }